

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O1

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          Orphanage *this,uint size)

{
  OrphanBuilder local_30;
  
  capnp::_::OrphanBuilder::initStructList
            (&local_30,this->arena,this->capTable,size,(StructSize)0x20001);
  (__return_storage_ptr__->builder).segment = local_30.segment;
  (__return_storage_ptr__->builder).capTable = local_30.capTable;
  (__return_storage_ptr__->builder).location = local_30.location;
  (__return_storage_ptr__->builder).tag.content = local_30.tag.content;
  return __return_storage_ptr__;
}

Assistant:

Orphan<RootType> Orphanage::newOrphan(uint size) const {
  return Orphan<RootType>(NewOrphanListImpl<RootType>::apply(arena, capTable, size));
}